

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O0

void swap_drawstring(char *str,guint8 *im,size_t w,size_t h)

{
  ulong uVar1;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  size_t bd;
  size_t fs;
  guint8 *local_40;
  guint8 *local_38;
  
  uVar1 = ((ulong)in_RCX >> 5) + 3 & 0xfffffffffffffffc;
  if ((ulong)in_RCX >> 6 < 0x11) {
    if ((ulong)in_RCX >> 6 < 8) {
      local_40 = (guint8 *)0x8;
    }
    else {
      local_40 = (guint8 *)((ulong)in_RCX >> 6);
    }
    local_38 = local_40;
  }
  else {
    local_38 = (guint8 *)0x10;
  }
  draw_string(in_RSI,in_RDX,in_RCX,(int)(uVar1 >> 0x20),(int)uVar1,local_38,unaff_retaddr,
              in_stack_00000008);
  return;
}

Assistant:

void swap_drawstring(const char *str, guint8 *im, size_t w, size_t h) {
    size_t fs = ROUND_UPTO(h / 32, 4);
    size_t bd = CLAMP(h / 64, 8, 16);
    draw_string(P2SC_FONT_DROIDBOLD, CLAMP(fs, 20, 32), str, bd, h - 3 - bd, im, w, h);
}